

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O3

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,PlusExpr *ptr)

{
  SubtreeWrapper *pSVar1;
  SubtreeWrapper *pSVar2;
  int iVar3;
  int iVar4;
  ExpressionWrapper *this_00;
  BinopExpression *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (**(ptr->first->super_Base)._vptr_Base)(ptr->first,this);
  pSVar1 = this->curr_wrapper;
  (**(ptr->second->super_Base)._vptr_Base)();
  pSVar2 = this->curr_wrapper;
  this_00 = (ExpressionWrapper *)operator_new(0x10);
  this_01 = (BinopExpression *)operator_new(0x20);
  iVar3 = (*pSVar1->_vptr_SubtreeWrapper[2])(pSVar1);
  iVar4 = (*pSVar2->_vptr_SubtreeWrapper[2])(pSVar2);
  IRT::BinopExpression::BinopExpression
            (this_01,PLUS,(Expression *)CONCAT44(extraout_var,iVar3),
             (Expression *)CONCAT44(extraout_var_00,iVar4));
  IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)this_01);
  this->curr_wrapper = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void ir_tree_visitor::visit(PlusExpr* ptr) {
    ptr->first->accept(this);
    auto lhs = curr_wrapper;
    ptr->second->accept(this);
    auto rhs = curr_wrapper;

    curr_wrapper = new IRT::ExpressionWrapper(
            new IRT::BinopExpression(
                    IRT::BinaryOperatorType::PLUS,
                    lhs->ToExpression(),
                    rhs->ToExpression()
            )
    );
}